

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O0

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,float minRate,float maxRate)

{
  value_type vVar1;
  float fVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  ulong uVar7;
  reference pvVar8;
  float local_cc;
  int local_c8;
  float local_c4;
  int tdx;
  float spikeStep;
  int numSpikes;
  float intensity;
  float *activation;
  int sid;
  float maxDelta;
  int activationId_2;
  int idx;
  size_t inputSize;
  uniform_real_distribution<float> timeNoiseDistribution;
  uniform_real_distribution<float> distribution;
  int activationId_1;
  int sampleId;
  int activationId;
  undefined1 local_70 [8];
  vector<float,_std::allocator<float>_> maxValues;
  allocator<float> local_45;
  value_type_conflict local_44;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> minValues;
  float maxRate_local;
  float minRate_local;
  float inputSimulationTime_local;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *spikeTrains_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *samples_local;
  
  minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = maxRate;
  bVar3 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::empty(samples);
  if (!bVar3) {
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](samples,0);
    sVar5 = std::vector<float,_std::allocator<float>_>::size(pvVar4);
    local_44 = 0.0;
    std::allocator<float>::allocator(&local_45);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_40,sVar5,&local_44,&local_45);
    std::allocator<float>::~allocator(&local_45);
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](samples,0);
    sVar5 = std::vector<float,_std::allocator<float>_>::size(pvVar4);
    activationId = 0;
    std::allocator<float>::allocator((allocator<float> *)((long)&sampleId + 3));
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_70,sVar5,
               (value_type_conflict *)&activationId,(allocator<float> *)((long)&sampleId + 3));
    std::allocator<float>::~allocator((allocator<float> *)((long)&sampleId + 3));
    activationId_1 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](samples,0);
      sVar5 = std::vector<float,_std::allocator<float>_>::size(pvVar4);
      if (sVar5 <= (ulong)(long)activationId_1) break;
      pvVar4 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](samples,0);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,(long)activationId_1);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,(long)activationId_1);
      *pvVar6 = vVar1;
      pvVar4 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](samples,0);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,(long)activationId_1);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_70,(long)activationId_1);
      *pvVar6 = vVar1;
      activationId_1 = activationId_1 + 1;
    }
    for (distribution._M_param._M_b = 0.0;
        sVar5 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size(samples), (ulong)(long)(int)distribution._M_param._M_b < sVar5;
        distribution._M_param._M_b = (float)((int)distribution._M_param._M_b + 1)) {
      distribution._M_param._M_a = 0.0;
      while( true ) {
        pvVar4 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,0);
        sVar5 = std::vector<float,_std::allocator<float>_>::size(pvVar4);
        if (sVar5 <= (ulong)(long)(int)distribution._M_param._M_a) break;
        pvVar4 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,(long)(int)distribution._M_param._M_b);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (pvVar4,(long)(int)distribution._M_param._M_a);
        fVar2 = *pvVar6;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_40,
                            (long)(int)distribution._M_param._M_a);
        if (fVar2 < *pvVar6) {
          pvVar4 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](samples,(long)(int)distribution._M_param._M_b);
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar4,(long)(int)distribution._M_param._M_a);
          vVar1 = *pvVar6;
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_40,
                              (long)(int)distribution._M_param._M_a);
          *pvVar6 = vVar1;
        }
        pvVar4 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,(long)(int)distribution._M_param._M_b);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           (pvVar4,(long)(int)distribution._M_param._M_a);
        fVar2 = *pvVar6;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_70,
                            (long)(int)distribution._M_param._M_a);
        if (*pvVar6 <= fVar2 && fVar2 != *pvVar6) {
          pvVar4 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](samples,(long)(int)distribution._M_param._M_b);
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar4,(long)(int)distribution._M_param._M_a);
          vVar1 = *pvVar6;
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_70,
                              (long)(int)distribution._M_param._M_a);
          *pvVar6 = vVar1;
        }
        distribution._M_param._M_a = (float)((int)distribution._M_param._M_a + 1);
      }
    }
    std::uniform_real_distribution<float>::uniform_real_distribution(&timeNoiseDistribution,0.0,1.0)
    ;
    std::uniform_real_distribution<float>::uniform_real_distribution
              ((uniform_real_distribution<float> *)((long)&inputSize + 4),0.0,1e-06);
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](samples,0);
    _activationId_2 = std::vector<float,_std::allocator<float>_>::size(pvVar4);
    sVar5 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(samples);
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(spikeTrains,sVar5);
    for (maxDelta = 0.0; uVar7 = (ulong)(int)maxDelta,
        sVar5 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size(samples), uVar7 < sVar5; maxDelta = (float)((int)maxDelta + 1)) {
      pvVar8 = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[](spikeTrains,(long)(int)maxDelta);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(pvVar8,_activationId_2);
    }
    for (sid = 0; (ulong)(long)sid < _activationId_2; sid = sid + 1) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_70,(long)sid);
      fVar2 = *pvVar6;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,(long)sid);
      activation._4_4_ = fVar2 - *pvVar6;
      for (activation._0_4_ = 0; uVar7 = (ulong)(int)activation,
          sVar5 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::size(samples), uVar7 < sVar5; activation._0_4_ = (int)activation + 1) {
        pvVar4 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,(long)(int)activation);
        _numSpikes = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,(long)sid);
        fVar2 = *_numSpikes;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_40,(long)sid);
        spikeStep = (fVar2 - *pvVar6) / activation._4_4_;
        tdx = (int)(inputSimulationTime *
                   (spikeStep *
                    (minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ - minRate) + minRate));
        local_c4 = inputSimulationTime / (float)tdx;
        for (local_c8 = 0; local_c8 < tdx; local_c8 = local_c8 + 1) {
          pvVar8 = std::
                   vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                   ::operator[](spikeTrains,(long)(int)activation);
          pvVar4 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](pvVar8,(long)sid);
          local_cc = (float)local_c8 * local_c4;
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(pvVar4,&local_cc);
        }
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_70);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_40);
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        float minRate, float maxRate )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            int numSpikes = static_cast<int>(inputSimulationTime * ( intensity * ( maxRate - minRate ) + minRate ));
            float spikeStep = inputSimulationTime / numSpikes;
            for ( int tdx = 0; tdx < numSpikes; ++tdx ) {
                spikeTrains[sid][activationId].emplace_back( tdx * spikeStep );
            }
        }
    }
}